

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void QSslSocketPrivate::setDefaultCaCertificates(QList<QSslCertificate> *certs)

{
  long lVar1;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
  *in_stack_ffffffffffffffb8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ensureInitialized();
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffc0,(QMutex *)in_stack_ffffffffffffffb8);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)in_stack_ffffffffffffffc0);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5c35);
  QList<QSslCertificate>::operator=
            ((QList<QSslCertificate> *)in_RDI,(QList<QSslCertificate> *)in_stack_ffffffffffffffb8);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)in_RDI);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            (in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a5c7c);
  QList<QSslCertificate>::operator=
            ((QList<QSslCertificate> *)in_RDI,(QList<QSslCertificate> *)in_stack_ffffffffffffffb8);
  s_loadRootCertsOnDemand = false;
  QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::setDefaultCaCertificates(const QList<QSslCertificate> &certs)
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    globalData()->config.detach();
    globalData()->config->caCertificates = certs;
    globalData()->dtlsConfig.detach();
    globalData()->dtlsConfig->caCertificates = certs;
    // when the certificates are set explicitly, we do not want to
    // load the system certificates on demand
    s_loadRootCertsOnDemand = false;
}